

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int CVmObjFileName::s_getp_getRootDirs(vm_val_t *retval,uint *oargc)

{
  vm_val_t *this;
  int iVar1;
  vm_obj_id_t vVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  CVmObject *pCVar6;
  int *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t ele;
  size_t len;
  CVmObjList *lst;
  char *p;
  int cnt;
  err_frame_t err_cur__;
  char *lclstr;
  char *buf;
  size_t buflen;
  uint argc;
  CVmNativeCodeDesc *in_stack_fffffffffffffe68;
  CVmObjList *in_stack_fffffffffffffe70;
  vm_val_t *in_stack_fffffffffffffe78;
  void *pvVar7;
  CCharmapToUni *in_stack_fffffffffffffe80;
  undefined8 uVar8;
  int access;
  char *in_stack_fffffffffffffea8;
  char *local_138;
  uint local_128 [2];
  undefined8 local_120;
  void *local_118;
  __jmp_buf_tag _Stack_110;
  void *local_48;
  char *local_40;
  size_t local_38;
  int local_1c;
  vm_val_t *local_10;
  
  if (in_RSI == (int *)0x0) {
    access = 0;
  }
  else {
    access = *in_RSI;
  }
  local_1c = access;
  local_10 = in_RDI;
  if ((s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc), iVar1 != 0))
  {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_getRootDirs::desc,0);
    __cxa_guard_release(&s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68);
  if (iVar1 == 0) {
    iVar1 = CVmNetFile::is_net_mode();
    if ((iVar1 == 0) && (local_38 = os_get_root_dirs((char *)0x0,0), local_38 != 0)) {
      local_40 = (char *)operator_new__(local_38);
      local_48 = (void *)0x0;
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      local_120 = *puVar3;
      plVar4 = (long *)_ZTW11G_err_frame();
      *plVar4 = (long)local_128;
      local_128[0] = _setjmp(&_Stack_110);
      if (local_128[0] == 0) {
        os_get_root_dirs(local_40,local_38);
        for (local_138 = local_40; this = local_10, *local_138 != '\0';
            local_138 = local_138 + sVar5 + 1) {
          CVmObjFile::query_safety_for_open(in_stack_fffffffffffffea8,access);
          sVar5 = strlen(local_138);
        }
        vVar2 = CVmObjList::create((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                   (size_t)in_stack_fffffffffffffe68);
        vm_val_t::set_obj(this,vVar2);
        if ((local_10->val).obj != 0) {
          pCVar6 = vm_objp(0);
          iVar1 = (*pCVar6->_vptr_CVmObject[1])(pCVar6,CVmObjList::metaclass_reg_);
          if (iVar1 != 0) {
            vm_objp(0);
          }
        }
        CVmObjList::cons_clear(in_stack_fffffffffffffe70);
        CVmStack::push(local_10);
        for (local_138 = local_40; *local_138 != '\0'; local_138 = local_138 + sVar5 + 1) {
          iVar1 = CVmObjFile::query_safety_for_open(in_stack_fffffffffffffea8,access);
          if (iVar1 != 0) {
            CCharmapToUni::map_str_alo
                      (in_stack_fffffffffffffe80,(char **)in_stack_fffffffffffffe78,
                       (char *)in_stack_fffffffffffffe70);
            vVar2 = create_from_local((char *)in_stack_fffffffffffffe70,
                                      (size_t)in_stack_fffffffffffffe68);
            vm_val_t::set_obj((vm_val_t *)&stack0xfffffffffffffea8,vVar2);
            free(local_48);
            local_48 = (void *)0x0;
            CVmObjList::cons_set_element
                      (in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                       (vm_val_t *)0x33d392);
          }
          sVar5 = strlen(local_138);
        }
        CVmStack::discard();
      }
      if ((local_128[0] & 0x8000) == 0) {
        local_128[0] = local_128[0] | 0x8000;
        if (local_40 != (char *)0x0) {
          operator_delete__(local_40);
        }
        if (local_48 != (void *)0x0) {
          free(local_48);
        }
      }
      uVar8 = local_120;
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      *puVar3 = uVar8;
      if ((local_128[0] & 0x4001) != 0) {
        puVar3 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(uint *)*puVar3 & 2) != 0) {
          plVar4 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar4 + 0x10));
        }
        pvVar7 = local_118;
        plVar4 = (long *)_ZTW11G_err_frame();
        *(void **)(*plVar4 + 0x10) = pvVar7;
        err_rethrow();
      }
      if ((local_128[0] & 2) != 0) {
        free(local_118);
      }
    }
    else {
      vVar2 = CVmObjList::create((int)((ulong)local_10 >> 0x20),(size_t)in_stack_fffffffffffffe68);
      vm_val_t::set_obj(local_10,vVar2);
    }
    CVmStack::discard(local_1c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::s_getp_getRootDirs(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* 
     *   See how much space we need for the root list.  If we're in network
     *   storage mode, there's no concept of a root folder, since everything
     *   is relative to the user+game folder.
     */
    size_t buflen;
    if (!CVmNetFile::is_net_mode(vmg0_)
        && (buflen = os_get_root_dirs(0, 0)) != 0)
    {
        /* allocate space */
        char *buf = new char[buflen];
        char *lclstr = 0;
        err_try
        {
            /* get the root list for real this time */
            os_get_root_dirs(buf, buflen);

            /* count the strings in the list, filtered for file safety */
            int cnt = 0;
            char *p;
            for (p = buf ; *p != '\0' ; p += strlen(p) + 1)
            {
                /* if we're allowed to get metadata on this path, count it */
                if (CVmObjFile::query_safety_for_open(
                    vmg_ p, VMOBJFILE_ACCESS_GETINFO))
                    ++cnt;
            }

            /* create the list; clear it and push it for gc protection */
            retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
            CVmObjList *lst = vm_objid_cast(CVmObjList, retval->val.obj);
            lst->cons_clear();
            G_stk->push(retval);

            /* build the list */
            for (p = buf, cnt = 0 ; *p != '\0' ; p += strlen(p) + 1)
            {
                /* check to see if we're allowed to access this root */
                if (CVmObjFile::query_safety_for_open(
                    vmg_ p, VMOBJFILE_ACCESS_GETINFO))
                {
                    /* map the string to utf8 */
                    size_t len = G_cmap_from_fname->map_str_alo(&lclstr, p);

                    /* create the FileName object */
                    vm_val_t ele;
                    ele.set_obj(create_from_local(vmg_ lclstr, len));

                    /* done with the mapped string */
                    t3free(lclstr);
                    lclstr = 0;
                    
                    /* add it to the list */
                    lst->cons_set_element(cnt++, &ele);
                }
            }

            /* done with our gc protection for the list */
            G_stk->discard();
        }
        err_finally
        {
            /* free the root list buffer */
            delete [] buf;

            /* free the mapped filename string */
            if (lclstr != 0)
                t3free(lclstr);
        }